

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool prvTidyResetOptionToDefault(TidyDocImpl *doc,TidyOptionId optId)

{
  TidyOptionImpl *option_00;
  bool local_31;
  TidyOptionValue *value;
  TidyOptionImpl *option;
  TidyOptionValue dflt;
  Bool status;
  TidyOptionId optId_local;
  TidyDocImpl *doc_local;
  
  local_31 = optId != TidyUnknownOption && optId < N_TIDY_OPTIONS;
  dflt.v._0_4_ = ZEXT14(local_31);
  if (dflt.v._0_4_ != 0) {
    option_00 = option_defs + optId;
    dflt.v._4_4_ = optId;
    _status = doc;
    if (optId != option_00->id) {
      __assert_fail("optId == option->id",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                    ,0x215,"Bool prvTidyResetOptionToDefault(TidyDocImpl *, TidyOptionId)");
    }
    GetOptionDefault(option_00,(TidyOptionValue *)&option);
    CopyOptionValue(_status,option_00,(doc->config).value + optId,(TidyOptionValue *)&option);
  }
  return dflt.v._0_4_;
}

Assistant:

Bool TY_(ResetOptionToDefault)( TidyDocImpl* doc, TidyOptionId optId )
{
    Bool status = ( optId > 0 && optId < N_TIDY_OPTIONS );
    if ( status )
    {
        TidyOptionValue dflt;
        const TidyOptionImpl* option = option_defs + optId;
        TidyOptionValue* value = &doc->config.value[ optId ];
        assert( optId == option->id );
        GetOptionDefault( option, &dflt );
        CopyOptionValue( doc, option, value, &dflt );
    }
    return status;
}